

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncInitializer.hpp
# Opt level: O2

ASYNC_TASK_STATUS __thiscall
Diligent::AsyncInitializer::Update(AsyncInitializer *this,bool WaitForCompletion)

{
  SpinLock *this_00;
  ASYNC_TASK_STATUS AVar1;
  bool bVar2;
  ASYNC_TASK_STATUS AVar3;
  char (*in_RCX) [40];
  SpinLockGuard Guard;
  ASYNC_TASK_STATUS CurrStatus;
  RefCntWeakPtr<Diligent::IAsyncTask> *local_60;
  undefined1 local_58 [8];
  string msg;
  
  AVar1 = (this->m_Status)._M_i;
  CurrStatus = AVar1;
  if (AVar1 == ASYNC_TASK_STATUS_UNKNOWN) {
    FormatString<char[26],char[40]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrStatus != ASYNC_TASK_STATUS_UNKNOWN",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Update",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/AsyncInitializer.hpp"
               ,0x35);
    std::__cxx11::string::~string((string *)&msg);
  }
  else if (ASYNC_TASK_STATUS_RUNNING < AVar1) goto LAB_001db6b1;
  msg._M_dataplus._M_p = (pointer)0x0;
  this_00 = &this->m_TaskLock;
  Threading::SpinLock::lock(this_00);
  local_60 = &this->m_wpTask;
  RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)local_58);
  RefCntAutoPtr<Diligent::IAsyncTask>::operator=
            ((RefCntAutoPtr<Diligent::IAsyncTask> *)&msg,
             (RefCntAutoPtr<Diligent::IAsyncTask> *)local_58);
  RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)local_58);
  Threading::SpinLock::unlock(this_00);
  if (msg._M_dataplus._M_p != (pointer)0x0) {
    if (WaitForCompletion) {
      (**(code **)(*(long *)msg._M_dataplus._M_p + 0x58))();
    }
    AVar3 = (**(code **)(*(long *)msg._M_dataplus._M_p + 0x38))();
    if (AVar3 - ASYNC_TASK_STATUS_CANCELLED < 2) {
      Threading::SpinLock::lock(this_00);
      RefCntWeakPtr<Diligent::IAsyncTask>::Release(local_60);
      Threading::SpinLock::unlock(this_00);
    }
    if (AVar1 < AVar3) {
      do {
        AVar1 = CurrStatus;
        if (CurrStatus <= AVar3) {
          AVar1 = AVar3;
        }
        bVar2 = std::atomic<Diligent::ASYNC_TASK_STATUS>::compare_exchange_weak
                          (&this->m_Status,&CurrStatus,AVar1,memory_order_seq_cst);
      } while (!bVar2);
    }
  }
  RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)&msg);
LAB_001db6b1:
  return (this->m_Status)._M_i;
}

Assistant:

ASYNC_TASK_STATUS Update(bool WaitForCompletion)
    {
        ASYNC_TASK_STATUS CurrStatus = m_Status.load();
        VERIFY_EXPR(CurrStatus != ASYNC_TASK_STATUS_UNKNOWN);
        if (CurrStatus <= ASYNC_TASK_STATUS_RUNNING)
        {
            RefCntAutoPtr<IAsyncTask> pTask;
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                pTask = m_wpTask.Lock();
            }

            ASYNC_TASK_STATUS NewStatus = ASYNC_TASK_STATUS_UNKNOWN;
            if (pTask)
            {
                if (WaitForCompletion)
                {
                    pTask->WaitForCompletion();
                }
                NewStatus = pTask->GetStatus();
            }

            if (NewStatus == ASYNC_TASK_STATUS_CANCELLED || NewStatus == ASYNC_TASK_STATUS_COMPLETE)
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                m_wpTask.Release();
            }

            if (NewStatus > CurrStatus)
            {
                while (!m_Status.compare_exchange_weak(CurrStatus, (std::max)(CurrStatus, NewStatus)))
                {
                    // If exchange fails, CurrStatus will hold the actual value of m_Status.
                }
            }
        }

        return m_Status.load();
    }